

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderBitfieldOperationTests.cpp
# Opt level: O0

void __thiscall
glcts::ShaderBitfieldOperationCase::~ShaderBitfieldOperationCase(ShaderBitfieldOperationCase *this)

{
  code *pcVar1;
  ShaderBitfieldOperationCase *this_local;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

ShaderBitfieldOperationCase::~ShaderBitfieldOperationCase()
{
}